

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles2::Functional::eval_addOne_ivec2(ShaderEvalContext *c)

{
  *(ulong *)((c->color).m_data + 1) =
       CONCAT44((float)((int)c->in[0].m_data[1] + 1),(float)((int)c->in[0].m_data[3] + 1));
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }